

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int checkcontrol(lua_State *L,char *message,int tocont)

{
  int iVar1;
  code *f;
  
  iVar1 = 0;
  if (tocont != 0) {
    return iVar1;
  }
  if (*message == '@') {
    iVar1 = strcmp(message + 1,"off");
    if (iVar1 == 0) {
      f = warnfoff;
    }
    else {
      iVar1 = strcmp(message + 1,"on");
      if (iVar1 != 0) {
        return 1;
      }
      f = warnfon;
    }
    lua_setwarnf(L,f,L);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int checkcontrol (lua_State *L, const char *message, int tocont) {
  if (tocont || *(message++) != '@')  /* not a control message? */
    return 0;
  else {
    if (strcmp(message, "off") == 0)
      lua_setwarnf(L, warnfoff, L);  /* turn warnings off */
    else if (strcmp(message, "on") == 0)
      lua_setwarnf(L, warnfon, L);   /* turn warnings on */
    return 1;  /* it was a control message */
  }
}